

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

void __thiscall leveldb::Table::ReadMeta(Table *this,Footer *footer)

{
  Rep *pRVar1;
  int iVar2;
  Block *this_00;
  Comparator *comparator;
  Iterator *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t __n;
  long in_FS_OFFSET;
  ReadOptions opt;
  BlockContents contents;
  string key;
  Slice local_80;
  ReadOptions local_70;
  BlockContents local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar1 = this->rep_;
  if ((pRVar1->options).filter_policy != (FilterPolicy *)0x0) {
    local_70.verify_checksums = false;
    local_70.fill_cache = true;
    local_70.snapshot = (Snapshot *)0x0;
    if ((pRVar1->options).paranoid_checks == true) {
      local_70.verify_checksums = true;
      local_70.fill_cache = true;
    }
    local_60.data.data_ = "";
    local_60.data.size_ = 0;
    ReadBlock((leveldb *)&local_48,pRVar1->file,&local_70,&footer->metaindex_handle_,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&local_60);
      comparator = BytewiseComparator();
      pIVar3 = Block::NewIterator(this_00,comparator);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"filter.","");
      iVar2 = (*((this->rep_->options).filter_policy)->_vptr_FilterPolicy[2])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_48,(char *)CONCAT44(extraout_var,iVar2));
      local_80.data_ = local_48._M_dataplus._M_p;
      (*pIVar3->_vptr_Iterator[5])(pIVar3);
      iVar2 = (*pIVar3->_vptr_Iterator[2])(pIVar3);
      if ((char)iVar2 != '\0') {
        iVar2 = (*pIVar3->_vptr_Iterator[8])(pIVar3);
        if (__n == CONCAT44(local_48._M_string_length._4_4_,(undefined4)local_48._M_string_length))
        {
          iVar2 = bcmp((void *)CONCAT44(extraout_var_00,iVar2),local_48._M_dataplus._M_p,__n);
          if (iVar2 == 0) {
            iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
            local_80.data_ = (char *)CONCAT44(extraout_var_01,iVar2);
            ReadFilter(this,&local_80);
          }
        }
      }
      (*pIVar3->_vptr_Iterator[1])(pIVar3);
      Block::~Block(this_00);
      operator_delete(this_00,0x18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      operator_delete__(local_48._M_dataplus._M_p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Table::ReadMeta(const Footer& footer) {
  if (rep_->options.filter_policy == nullptr) {
    return;  // Do not need any metadata
  }

  // TODO(sanjay): Skip this if footer.metaindex_handle() size indicates
  // it is an empty block.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents contents;
  if (!ReadBlock(rep_->file, opt, footer.metaindex_handle(), &contents).ok()) {
    // Do not propagate errors since meta info is not needed for operation
    return;
  }
  Block* meta = new Block(contents);

  Iterator* iter = meta->NewIterator(BytewiseComparator());
  std::string key = "filter.";
  key.append(rep_->options.filter_policy->Name());
  iter->Seek(key);
  if (iter->Valid() && iter->key() == Slice(key)) {
    ReadFilter(iter->value());
  }
  delete iter;
  delete meta;
}